

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectorFederateManager.cpp
# Opt level: O3

int __thiscall helics::ConnectorFederateManager::getFilterCount(ConnectorFederateManager *this)

{
  shared_mutex *__rwlock;
  int iVar1;
  
  if ((this->filters).enabled == false) {
    iVar1 = (int)(this->filters).m_obj.dataStorage.csize;
  }
  else {
    __rwlock = &(this->filters).m_mutex;
    std::__shared_mutex_pthread::lock_shared(&__rwlock->_M_impl);
    iVar1 = (int)(this->filters).m_obj.dataStorage.csize;
    pthread_rwlock_unlock((pthread_rwlock_t *)__rwlock);
  }
  return iVar1;
}

Assistant:

int ConnectorFederateManager::getFilterCount() const
{
    return static_cast<int>(filters.lock_shared()->size());
}